

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void export_syms(symtbl_t *tbl)

{
  char *pcVar1;
  int *in_RDI;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar2;
  
  for (uVar2 = 0; uVar2 < (uint)in_RDI[1]; uVar2 = uVar2 + 1) {
    if ((*(int *)(*(long *)(*(long *)(in_RDI + 4) + (ulong)uVar2 * 8) + 0x24) == 0) &&
       (*in_RDI == 0)) {
      fprintf((FILE *)f,".global %s\n",*(undefined8 *)(*(long *)(in_RDI + 4) + (ulong)uVar2 * 8));
    }
  }
  for (uVar2 = 0; uVar2 < (uint)in_RDI[1]; uVar2 = uVar2 + 1) {
    if (*(int *)(*(long *)(*(long *)(in_RDI + 4) + (ulong)uVar2 * 8) + 0x24) == 0) {
      fprintf((FILE *)f,"%s:",*(undefined8 *)(*(long *)(in_RDI + 4) + (ulong)uVar2 * 8));
      pcVar1 = ".byte";
      if (*(int *)(*(long *)(*(long *)(in_RDI + 4) + (ulong)uVar2 * 8) + 0x20) == 0x85) {
        pcVar1 = ".word";
      }
      fprintf((FILE *)f," %s\n",pcVar1);
    }
  }
  for (uVar2 = 0; uVar2 < (uint)in_RDI[2]; uVar2 = uVar2 + 1) {
    export_syms((symtbl_t *)CONCAT44(uVar2,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void export_syms(symtbl_t* tbl)
{
    unsigned int i;

    for (i = 0; i < tbl->num_syms; ++i)
    {
        if (tbl->syms[i]->function)
            continue;
        if (tbl->scope_id == 0)
            fprintf(f, ".global %s\n", tbl->syms[i]->id);
    }

    for (i = 0; i < tbl->num_syms; ++i)
    {
        if (tbl->syms[i]->function)
            continue;

        fprintf(f, "%s:", tbl->syms[i]->id);
        fprintf(f, " %s\n", tbl->syms[i]->type_id == WORD ? ".word" : ".byte");
    }

    for (i = 0; i < tbl->num_children; i++)
        export_syms(tbl->children[i]);
}